

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void draw_more_3d_stuff(GPU_Target *screen)

{
  uint uVar1;
  float t;
  GPU_Target *screen_local;
  
  begin_3d(screen);
  uVar1 = SDL_GetTicks();
  GPU_Rotate(((float)uVar1 / 1000.0) * 60.0,0.0,0.0,1.0);
  GPU_Translate(0.4,0.4,0.0);
  draw_spinning_triangle();
  end_3d(screen);
  return;
}

Assistant:

void draw_more_3d_stuff(GPU_Target* screen)
{
	float t;
    begin_3d(screen);
    
    t = SDL_GetTicks()/1000.0f;
    GPU_Rotate(t*60, 0, 0, 1);
    GPU_Translate(0.4f, 0.4f, 0);
    draw_spinning_triangle();
    
    end_3d(screen);
}